

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

int lookup_flag(char **flag_table,char *flag_name)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  int i;
  char *flag_name_local;
  char **flag_table_local;
  
  local_1c = 1;
  while( true ) {
    bVar2 = false;
    if (flag_table[local_1c] != (char *)0x0) {
      iVar1 = strcmp(flag_table[local_1c],flag_name);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_1c = local_1c + 1;
  }
  if (flag_table[local_1c] == (char *)0x0) {
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

int lookup_flag(const char **flag_table, const char *flag_name) {
	int i = FLAG_START;

	while (flag_table[i] && !streq(flag_table[i], flag_name))
		i++;

	/* End of table reached without match */
	if (!flag_table[i]) i = FLAG_END;

	return i;
}